

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1501.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  timeval older_01;
  __time_t local_2a0;
  __suseconds_t local_298;
  __time_t _Stack_278;
  CURLMcode ec_7;
  __suseconds_t local_270;
  int ec_6;
  CURLMcode ec_5;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int e;
  timeval after;
  timeval before;
  undefined1 local_1f8 [4];
  int maxfd;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval timeout;
  CURLMcode ec_4;
  CURLMcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_38;
  int local_30;
  int local_2c;
  int still_running;
  int res;
  CURLM *mhandle;
  CURL *handle;
  char *URL_local;
  
  mhandle = (CURLM *)0x0;
  _still_running = 0;
  local_2c = 0;
  local_30 = 0;
  handle = (CURL *)URL;
  tVar7 = tutil_tvnow();
  _ec_1 = tVar7.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_38 = tVar7.tv_usec;
  tv_test_start.tv_usec = local_38;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                  ,0x3c,iVar2,uVar3);
    local_2c = iVar2;
  }
  if (local_2c == 0) {
    mhandle = (CURLM *)curl_easy_init();
    if (mhandle == (CURLM *)0x0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                    ,0x3e);
      local_2c = 0x7c;
    }
    if (local_2c == 0) {
      iVar2 = curl_easy_setopt(mhandle,0x2712,handle);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                      ,0x40,iVar2,uVar3);
        local_2c = iVar2;
      }
      if (local_2c == 0) {
        iVar2 = curl_easy_setopt(mhandle,0x29,1);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                        ,0x41,iVar2,uVar3);
          local_2c = iVar2;
        }
        if (local_2c == 0) {
          _still_running = curl_multi_init();
          if (_still_running == 0) {
            curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                          ,0x43);
            local_2c = 0x7b;
          }
          if (local_2c == 0) {
            iVar2 = curl_multi_add_handle(_still_running,mhandle);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                            ,0x45,iVar2,uVar3);
              local_2c = iVar2;
            }
            if (local_2c == 0) {
              iVar2 = curl_multi_perform(_still_running,&local_30);
              uVar1 = _stderr;
              if (iVar2 == 0) {
                if (local_30 < 0) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                                ,0x47,local_30);
                  local_2c = 0x7a;
                }
              }
              else {
                uVar3 = curl_multi_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                              ,0x47,iVar2,uVar3);
                local_2c = iVar2;
              }
              if (local_2c == 0) {
                tVar7 = tutil_tvnow();
                older.tv_usec = tv_test_start.tv_usec;
                older.tv_sec = tv_test_start.tv_sec;
                lVar4 = tutil_tvdiff(tVar7,older);
                if (30000 < lVar4) {
                  curl_mfprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                                ,0x49);
                  local_2c = 0x7d;
                }
                if (local_2c == 0) {
                  do {
                    if (local_30 == 0) goto LAB_00102b8c;
                    before.tv_usec._4_4_ = -99;
                    fdread.__fds_bits[0xf] = 0;
                    for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
                      fdwrite.__fds_bits[(ulong)(uint)__arr + 0xf] = 0;
                    }
                    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1)
                    {
                      fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                    }
                    for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1)
                    {
                      *(undefined8 *)(local_1f8 + (ulong)__arr_2._4_4_ * 8) = 0;
                    }
                    iVar2 = curl_multi_fdset(_still_running,fdwrite.__fds_bits + 0xf,
                                             fdexcep.__fds_bits + 0xf,local_1f8,
                                             (undefined1 *)((long)&before.tv_usec + 4));
                    uVar1 = _stderr;
                    if (iVar2 == 0) {
                      if (before.tv_usec._4_4_ < -1) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                                      ,0x5c,before.tv_usec._4_4_);
                        local_2c = 0x7a;
                      }
                    }
                    else {
                      uVar3 = curl_multi_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                                    ,0x5c,iVar2,uVar3);
                      local_2c = iVar2;
                    }
                    if (local_2c != 0) goto LAB_00102b8c;
                    iVar2 = select_wrapper(before.tv_usec._4_4_ + 1,
                                           (fd_set *)(fdwrite.__fds_bits + 0xf),
                                           (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)local_1f8,
                                           (timeval *)(fdread.__fds_bits + 0xf));
                    if (iVar2 == -1) {
                      piVar5 = __errno_location();
                      uVar1 = _stderr;
                      iVar2 = *piVar5;
                      pcVar6 = strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                                    ,0x60,iVar2,pcVar6);
                      local_2c = 0x79;
                    }
                    if (local_2c != 0) goto LAB_00102b8c;
                    tVar7 = tutil_tvnow();
                    older_00.tv_usec = tv_test_start.tv_usec;
                    older_00.tv_sec = tv_test_start.tv_sec;
                    lVar4 = tutil_tvdiff(tVar7,older_00);
                    if (30000 < lVar4) {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                                    ,0x62);
                      local_2c = 0x7d;
                    }
                    if (local_2c != 0) goto LAB_00102b8c;
                    curl_mfprintf(_stderr,"ping\n");
                    tVar7 = tutil_tvnow();
                    _Stack_278 = tVar7.tv_sec;
                    after.tv_usec = _Stack_278;
                    local_270 = tVar7.tv_usec;
                    before.tv_sec = local_270;
                    iVar2 = curl_multi_perform(_still_running,&local_30);
                    uVar1 = _stderr;
                    if (iVar2 == 0) {
                      if (local_30 < 0) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                                      ,0x67,local_30);
                        local_2c = 0x7a;
                      }
                    }
                    else {
                      uVar3 = curl_multi_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                                    ,0x67,iVar2,uVar3);
                      local_2c = iVar2;
                    }
                    if (local_2c != 0) goto LAB_00102b8c;
                    tVar7 = tutil_tvnow();
                    older_01.tv_usec = tv_test_start.tv_usec;
                    older_01.tv_sec = tv_test_start.tv_sec;
                    lVar4 = tutil_tvdiff(tVar7,older_01);
                    if (30000 < lVar4) {
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1501.c"
                                    ,0x69);
                      local_2c = 0x7d;
                    }
                    if (local_2c != 0) goto LAB_00102b8c;
                    tVar7 = tutil_tvnow();
                    local_2a0 = tVar7.tv_sec;
                    ___i = local_2a0;
                    local_298 = tVar7.tv_usec;
                    after.tv_sec = local_298;
                    iVar2 = elapsed((timeval *)&after.tv_usec,(timeval *)&__i);
                    curl_mfprintf(_stderr,"pong = %d\n",iVar2);
                  } while (iVar2 < 0x7a121);
                  local_2c = 100;
                }
              }
            }
          }
        }
      }
    }
LAB_00102b8c:
    curl_multi_cleanup(_still_running);
    curl_easy_cleanup(mhandle);
    curl_global_cleanup();
    URL_local._4_4_ = local_2c;
  }
  else {
    URL_local._4_4_ = local_2c;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *handle = NULL;
  CURLM *mhandle = NULL;
  int res = 0;
  int still_running = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(handle);

  easy_setopt(handle, CURLOPT_URL, URL);
  easy_setopt(handle, CURLOPT_VERBOSE, 1L);

  multi_init(mhandle);

  multi_add_handle(mhandle, handle);

  multi_perform(mhandle, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;
    struct timeval before;
    struct timeval after;
    int e;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(mhandle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    fprintf(stderr, "ping\n");
    before = tutil_tvnow();

    multi_perform(mhandle, &still_running);

    abort_on_test_timeout();

    after = tutil_tvnow();
    e = elapsed(&before, &after);
    fprintf(stderr, "pong = %d\n", e);

    if(e > MAX_BLOCKED_TIME_US) {
      res = 100;
      break;
    }
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(mhandle);
  curl_easy_cleanup(handle);
  curl_global_cleanup();

  return res;
}